

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void lyxp_expr_free(lyxp_expr *expr)

{
  ushort local_12;
  uint16_t i;
  lyxp_expr *expr_local;
  
  if (expr != (lyxp_expr *)0x0) {
    free(expr->expr);
    free(expr->tokens);
    free(expr->expr_pos);
    free(expr->tok_len);
    if (expr->repeat != (lyxp_expr_type **)0x0) {
      for (local_12 = 0; local_12 < expr->used; local_12 = local_12 + 1) {
        free(expr->repeat[local_12]);
      }
    }
    free(expr->repeat);
    free(expr);
  }
  return;
}

Assistant:

void
lyxp_expr_free(struct lyxp_expr *expr)
{
    uint16_t i;

    if (!expr) {
        return;
    }

    free(expr->expr);
    free(expr->tokens);
    free(expr->expr_pos);
    free(expr->tok_len);
    if (expr->repeat) {
        for (i = 0; i < expr->used; ++i) {
            free(expr->repeat[i]);
        }
    }
    free(expr->repeat);
    free(expr);
}